

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

void Abc_NtkDressPrintStats(Vec_Ptr_t *vRes,int nNodes0,int nNodes1,abctime Time)

{
  uint uVar1;
  int iVar2;
  int i;
  Vec_Int_t *p;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  double dVar12;
  int local_64;
  int local_60;
  
  local_60 = 0;
  iVar9 = 0;
  iVar2 = 0;
  local_64 = 0;
  uVar4 = 0;
  uVar6 = 0;
  for (i = 0; i < vRes->nSize; i = i + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,i);
    iVar5 = 0;
    iVar10 = 0;
    iVar7 = 0;
    iVar3 = 0;
    for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
      uVar1 = Vec_IntEntry(p,iVar8);
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 2) == 0) {
          iVar10 = iVar10 + 1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
      }
      else if ((uVar1 & 2) == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        iVar7 = iVar7 + 1;
      }
    }
    iVar2 = iVar2 + iVar10;
    local_64 = local_64 + iVar5;
    local_60 = local_60 + iVar3;
    iVar9 = iVar9 + iVar7;
    iVar8 = iVar5 + iVar7;
    if (iVar3 + iVar10 < iVar5 + iVar7) {
      iVar8 = iVar3 + iVar10;
    }
    uVar4 = uVar4 + iVar8;
    if (iVar3 < iVar7) {
      iVar7 = iVar3;
    }
    if (iVar10 < iVar5) {
      iVar5 = iVar10;
    }
    uVar6 = iVar5 + uVar6 + iVar7;
  }
  printf("Total number of equiv classes                = %7d.\n");
  uVar11 = iVar2 + local_60;
  uVar1 = iVar9 + local_64;
  printf("Participating nodes from both networks       = %7d.\n",(ulong)(uVar11 + uVar1));
  dVar12 = (double)(nNodes0 + 1);
  printf("Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n",
         ((double)(int)uVar11 * 100.0) / dVar12,(ulong)uVar11);
  printf("Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n",
         ((double)(int)uVar1 * 100.0) / (double)(nNodes1 + 1),(ulong)uVar1);
  printf("Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n",
         ((double)(int)uVar4 * 100.0) / dVar12,(ulong)uVar4);
  iVar2 = 0x7a01e8;
  printf("Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n",
         ((double)(int)uVar6 * 100.0) / dVar12,(ulong)uVar6);
  Abc_Print(iVar2,"%s =","Total runtime");
  Abc_Print(iVar2,"%9.2f sec\n",(double)Time / 1000000.0);
  return;
}

Assistant:

void Abc_NtkDressPrintStats( Vec_Ptr_t * vRes, int nNodes0, int nNodes1, abctime Time )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    int NegAll[2] = {0}, PosAll[2] = {0}, PairsAll = 0, PairsOne = 0;
    int Pos[2], Neg[2];
    // count the number of equivalences in each class
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        Pos[0] = Pos[1] = 0;
        Neg[0] = Neg[1] = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[1]++; // negative polarity in network 1
                else
                    Pos[1]++; // positive polarity in network 1
            }
            else
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[0]++; // negative polarity in network 0
                else
                    Pos[0]++; // positive polarity in network 0
            }
        }
        PosAll[0] += Pos[0]; // total positive polarity in network 0
        PosAll[1] += Pos[1]; // total positive polarity in network 1
        NegAll[0] += Neg[0]; // total negative polarity in network 0
        NegAll[1] += Neg[1]; // total negative polarity in network 1

        // assuming that the name can be transferred to only one node
        PairsAll += Abc_MinInt(Neg[0] + Pos[0], Neg[1] + Pos[1]);
        PairsOne += Abc_MinInt(Neg[0], Neg[1]) + Abc_MinInt(Pos[0], Pos[1]);
    }
    printf( "Total number of equiv classes                = %7d.\n", Vec_PtrSize(vRes) );
    printf( "Participating nodes from both networks       = %7d.\n", NegAll[0]+PosAll[0]+NegAll[1]+PosAll[1] );
    printf( "Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n", NegAll[0]+PosAll[0], 100.0*(NegAll[0]+PosAll[0])/(nNodes0+1) );
    printf( "Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n", NegAll[1]+PosAll[1], 100.0*(NegAll[1]+PosAll[1])/(nNodes1+1) );
    printf( "Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n", PairsAll, 100.0*PairsAll/(nNodes0+1) );
    printf( "Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n", PairsOne, 100.0*PairsOne/(nNodes0+1) );
    ABC_PRT( "Total runtime", Time );
}